

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_test_duplicate_non_refresh_registrations_do_not_add_controls_Test::
~SubjectSetRegisterTest_test_duplicate_non_refresh_registrations_do_not_add_controls_Test
          (SubjectSetRegisterTest_test_duplicate_non_refresh_registrations_do_not_add_controls_Test
           *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, test_duplicate_non_refresh_registrations_do_not_add_controls)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_SUBJECT0, false);
    subject_register.Register(SS_SUBJECT0, false);

    subject_register.Register(SS_SUBJECT1, false);
    subject_register.Register(SS_SUBJECT1, false);
    subject_register.Register(SS_SUBJECT1, false);

    std::optional<SubscriptionSync> message = subject_register.NextSubscriptionSync();
    ASSERT_TRUE(message);
    EXPECT_TRUE(message->GetControls().empty());
}